

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVm.cpp
# Opt level: O3

void RunFunctionInlining(ExpressionContext *ctx,VmModule *module,VmValue *value)

{
  VmValueType VVar1;
  VmValue *pVVar2;
  long *plVar3;
  ScopeData *pSVar4;
  VariableData *pVVar5;
  SynBase *pSVar6;
  TypeBase *pTVar7;
  VmBlock *pVVar8;
  bool bVar9;
  VmConstant *pVVar10;
  FunctionData *pFVar11;
  VmConstant *pVVar12;
  VmValue *pVVar13;
  Node *pNVar14;
  uint uVar15;
  ulong uVar16;
  uint uVar17;
  uint uVar18;
  int iVar19;
  VmConstant *in_R9;
  VmFunction *pVVar20;
  VariableHandle *pVVar21;
  VmType type;
  VmConstant *redirect;
  VmInstruction *instCopy;
  SmallDenseMap<VariableData_*,_VmConstant_*,_VariableDataHasher,_16U> variableRemap;
  SmallDenseMap<VmInstruction_*,_VmInstruction_*,_VmInstructionHasher,_16U> instructionRemap;
  undefined8 in_stack_fffffffffffffd28;
  VmInstruction *pVVar22;
  VmInstruction *instruction;
  VmInstruction *local_2b0;
  VmFunction *local_2a8;
  VmConstant *local_2a0;
  uint local_294;
  VmConstant *local_290;
  TypeBase *local_288;
  VmInstruction *local_280;
  VmConstant *local_278;
  VmConstant *local_270;
  SynBase *local_268;
  SmallDenseMap<VariableData_*,_VmConstant_*,_VariableDataHasher,_16U> local_260;
  SmallDenseMap<VmInstruction_*,_VmInstruction_*,_VmInstructionHasher,_16U> local_148;
  
  if (value == (VmValue *)0x0) {
    return;
  }
  uVar18 = value->typeID;
  if (uVar18 != 2) {
    if (uVar18 == 3) {
      module->currentBlock = (VmBlock *)value;
      pVVar13 = (VmValue *)value[1].comment.end;
      while (pVVar13 != (VmValue *)0x0) {
        pVVar2 = pVVar13[1].users.little[0];
        RunFunctionInlining(ctx,module,pVVar13);
        pVVar13 = pVVar2;
      }
      module->currentBlock = (VmBlock *)0x0;
      return;
    }
    if (uVar18 != 4) {
      return;
    }
    module->currentFunction = (VmFunction *)value;
    pVVar13 = (VmValue *)value[1].source;
    while (pVVar13 != (VmValue *)0x0) {
      pVVar2 = (VmValue *)pVVar13[1].comment.begin;
      RunFunctionInlining(ctx,module,pVVar13);
      pVVar13 = pVVar2;
    }
    module->currentFunction = (VmFunction *)0x0;
    return;
  }
  if (*(int *)&value[1]._vptr_VmValue != 0x1f) {
    return;
  }
  VVar1 = value[1].type.type;
  if (VVar1 == VM_TYPE_VOID) {
LAB_001a28b2:
    __assert_fail("index < count",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h"
                  ,0x199,
                  "T &SmallArray<VmValue *, 4>::operator[](unsigned int) [T = VmValue *, N = 4]");
  }
  plVar3 = *(long **)&value[1].typeID;
  pVVar12 = (VmConstant *)*plVar3;
  if ((pVVar12->super_VmValue).type.type == VM_TYPE_FUNCTION_REF) {
    return;
  }
  if (VVar1 == VM_TYPE_INT) goto LAB_001a28b2;
  pVVar20 = (VmFunction *)plVar3[1];
  if ((pVVar20 == (VmFunction *)0x0) || ((pVVar20->super_VmValue).typeID != 4)) {
    pVVar20 = (VmFunction *)0x0;
  }
  if (VVar1 < VM_TYPE_LONG) goto LAB_001a28b2;
  pVVar10 = (VmConstant *)plVar3[2];
  if ((pVVar10 == (VmConstant *)0x0) || ((pVVar10->super_VmValue).typeID != 1)) {
    pVVar10 = (VmConstant *)0x0;
  }
  if (pVVar20->checkedInline == true) {
    if ((pVVar20->canInline & 1U) == 0) {
      return;
    }
  }
  else {
    pVVar20->checkedInline = true;
    bVar9 = CheckFunctionForInlining(pVVar20);
    pVVar20->canInline = bVar9;
    if (!bVar9) {
      return;
    }
  }
  module->currentBlock->insertPoint = (VmInstruction *)value;
  pSVar4 = pVVar20->scope;
  local_260.data = local_260.storage;
  local_260.allocator = (Allocator *)0x0;
  local_260.bucketCount = 0x10;
  local_260.count = 0;
  local_278 = pVVar12;
  NULLC::fillMemory(local_260.data,0,0x100);
  local_288 = pVVar20->function->type->returnType;
  local_2a8 = pVVar20;
  local_270 = pVVar10;
  if ((local_288 == (TypeBase *)0x0) || (local_288->typeID != 1)) {
    in_R9 = (VmConstant *)0x1;
    local_2a0 = anon_unknown.dwarf_107107::CreateAlloca
                          (ctx,module,value->source,local_288,"inline_res",true);
  }
  else {
    local_2a0 = (VmConstant *)0x0;
  }
  uVar18 = (pSVar4->allVariables).count;
  if (uVar18 != 0) {
    uVar16 = 0;
    do {
      local_148._0_8_ = (pSVar4->allVariables).data[uVar16];
      if ((((VariableData *)local_148._0_8_)->users).count != 0) {
        in_R9 = (VmConstant *)0x0;
        local_2b0 = (VmInstruction *)
                    anon_unknown.dwarf_107107::CreateAlloca
                              (ctx,module,((VariableData *)local_148._0_8_)->source,
                               ((VariableData *)local_148._0_8_)->type,"inline_var",false);
        SmallDenseMap<VariableData_*,_VmConstant_*,_VariableDataHasher,_16U>::insert
                  (&local_260,(VariableData **)&local_148,(VmConstant **)&local_2b0);
        uVar18 = (pSVar4->allVariables).count;
      }
      uVar16 = uVar16 + 1;
    } while (uVar16 < uVar18);
  }
  uVar18 = (local_2a8->allocas).count;
  pVVar22 = (VmInstruction *)value;
  if (uVar18 != 0) {
    uVar16 = 0;
    do {
      local_148._0_8_ = (local_2a8->allocas).data[uVar16];
      if ((((VariableData *)local_148._0_8_)->users).count != 0) {
        if (local_260.bucketCount != 0) {
          uVar17 = ((VariableData *)local_148._0_8_)->uniqueId;
          in_R9 = (VmConstant *)0x0;
          uVar15 = local_260.bucketCount;
          do {
            uVar17 = uVar17 & local_260.bucketCount - 1;
            if (local_260.data[uVar17].key == (VariableData *)0x0) break;
            if (local_260.data[uVar17].key == (VariableData *)local_148._0_8_) goto LAB_001a230f;
            uVar17 = uVar17 + (int)in_R9 + 1;
            in_R9 = (VmConstant *)(ulong)((int)in_R9 + 1);
            uVar15 = uVar15 - 1;
          } while (uVar15 != 0);
        }
        in_R9 = (VmConstant *)0x0;
        local_2b0 = (VmInstruction *)
                    anon_unknown.dwarf_107107::CreateAlloca
                              (ctx,module,((VariableData *)local_148._0_8_)->source,
                               ((VariableData *)local_148._0_8_)->type,"inline_alloca",false);
        SmallDenseMap<VariableData_*,_VmConstant_*,_VariableDataHasher,_16U>::insert
                  (&local_260,(VariableData **)&local_148,(VmConstant **)&local_2b0);
        uVar18 = (local_2a8->allocas).count;
      }
LAB_001a230f:
      uVar16 = uVar16 + 1;
    } while (uVar16 < uVar18);
  }
  pFVar11 = local_2a8->function;
  pVVar21 = (pFVar11->argumentVariables).head;
  if (pVVar21 != (VariableHandle *)0x0) {
    uVar18 = 3;
    do {
      local_294 = uVar18;
      if ((((VmInstruction *)value)->arguments).count <= uVar18) goto LAB_001a28b2;
      pVVar5 = pVVar21->variable;
      value = &pVVar22->super_VmValue;
      if ((pVVar5->users).count != 0) {
        if (local_260.bucketCount == 0) {
LAB_001a2893:
          __assert_fail("addressPtr",
                        "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                        ,0x1a21,
                        "void RunFunctionInlining(ExpressionContext &, VmModule *, VmValue *)");
        }
        pVVar12 = (VmConstant *)(pVVar22->arguments).data[uVar18];
        uVar18 = pVVar5->uniqueId;
        iVar19 = 0;
        uVar17 = local_260.bucketCount;
        while( true ) {
          uVar18 = uVar18 & local_260.bucketCount - 1;
          uVar16 = (ulong)uVar18;
          in_R9 = (VmConstant *)(uVar16 * 0x10);
          if (local_260.data[uVar16].key == (VariableData *)0x0) goto LAB_001a2893;
          if (local_260.data[uVar16].key == pVVar5) break;
          uVar18 = uVar18 + iVar19 + 1;
          iVar19 = iVar19 + 1;
          uVar17 = uVar17 - 1;
          if (uVar17 == 0) goto LAB_001a2893;
        }
        pNVar14 = local_260.data + uVar16;
        if (pVVar12 == (VmConstant *)0x0) {
LAB_001a2431:
          pSVar6 = (pVVar22->super_VmValue).source;
          pTVar7 = pVVar5->type;
          pVVar10 = CloneRemappedPointer(ctx,pNVar14->value);
          in_stack_fffffffffffffd28 = 0;
          anon_unknown.dwarf_107107::CreateStore
                    (ctx,module,pSVar6,pTVar7,&pVVar10->super_VmValue,(VmValue *)pVVar12,0);
          in_R9 = pVVar12;
          value = &pVVar22->super_VmValue;
        }
        else {
          uVar18 = (pVVar12->super_VmValue).typeID;
          if (uVar18 == 1) {
            if (pVVar12->isFloat == true) {
              local_290 = (VmConstant *)CONCAT44(local_290._4_4_,pVVar12->iValue);
              local_268 = (pVVar22->super_VmValue).source;
              pTVar7 = pVVar5->type;
              pVVar10 = CloneRemappedPointer(ctx,pNVar14->value);
              in_R9 = CreateConstantDouble
                                (ctx->allocator,(pVVar12->super_VmValue).source,
                                 (double)local_290._0_4_);
              in_stack_fffffffffffffd28 = 0;
              anon_unknown.dwarf_107107::CreateStore
                        (ctx,module,local_268,pTVar7,&pVVar10->super_VmValue,&in_R9->super_VmValue,0
                        );
              value = &pVVar22->super_VmValue;
            }
            else {
              local_290 = pVVar12;
              if ((pVVar12->super_VmValue).type.size != 0) {
                pSVar6 = (pVVar22->super_VmValue).source;
                pTVar7 = pVVar5->type;
                pVVar12 = CloneRemappedPointer(ctx,pNVar14->value);
                in_stack_fffffffffffffd28 = 0;
                in_R9 = local_290;
                anon_unknown.dwarf_107107::CreateStore
                          (ctx,module,pSVar6,pTVar7,&pVVar12->super_VmValue,
                           &local_290->super_VmValue,0);
                value = &pVVar22->super_VmValue;
              }
            }
          }
          else {
            if (uVar18 != 2) goto LAB_001a2431;
            pSVar6 = (pVVar22->super_VmValue).source;
            pTVar7 = pVVar5->type;
            if (pVVar12->iValue == 0x11) {
              pVVar10 = CloneRemappedPointer(ctx,pNVar14->value);
              if ((int)pVVar12->lValue == 0) goto LAB_001a28b2;
              in_R9 = *(VmConstant **)pVVar12->dValue;
              in_stack_fffffffffffffd28 = 0;
              anon_unknown.dwarf_107107::CreateStore
                        (ctx,module,pSVar6,pTVar7,&pVVar10->super_VmValue,&in_R9->super_VmValue,0);
              value = &pVVar22->super_VmValue;
            }
            else {
              pVVar10 = CloneRemappedPointer(ctx,pNVar14->value);
              in_stack_fffffffffffffd28 = 0;
              anon_unknown.dwarf_107107::CreateStore
                        (ctx,module,pSVar6,pTVar7,&pVVar10->super_VmValue,(VmValue *)pVVar12,0);
              in_R9 = pVVar12;
              value = &pVVar22->super_VmValue;
            }
          }
        }
      }
      uVar18 = local_294 + 1;
      pVVar21 = pVVar21->next;
      pVVar22 = (VmInstruction *)value;
    } while (pVVar21 != (VariableHandle *)0x0);
    pFVar11 = local_2a8->function;
  }
  pVVar20 = local_2a8;
  pVVar5 = pFVar11->contextArgument;
  if ((pVVar5 != (VariableData *)0x0) && ((pVVar5->users).count != 0)) {
    if (local_260.bucketCount != 0) {
      uVar18 = pVVar5->uniqueId;
      iVar19 = 0;
      uVar17 = local_260.bucketCount;
      do {
        uVar18 = uVar18 & local_260.bucketCount - 1;
        if (local_260.data[uVar18].key == (VariableData *)0x0) break;
        if (local_260.data[uVar18].key == pVVar5) {
          pSVar6 = (pVVar22->super_VmValue).source;
          pTVar7 = pVVar5->type;
          pVVar12 = CloneRemappedPointer(ctx,local_260.data[uVar18].value);
          in_stack_fffffffffffffd28 = 0;
          in_R9 = local_278;
          anon_unknown.dwarf_107107::CreateStore
                    (ctx,module,pSVar6,pTVar7,&pVVar12->super_VmValue,&local_278->super_VmValue,0);
          goto LAB_001a2635;
        }
        uVar18 = uVar18 + iVar19 + 1;
        iVar19 = iVar19 + 1;
        uVar17 = uVar17 - 1;
      } while (uVar17 != 0);
    }
    __assert_fail("addressPtr",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                  ,0x1a45,"void RunFunctionInlining(ExpressionContext &, VmModule *, VmValue *)");
  }
LAB_001a2635:
  pVVar8 = pVVar20->firstBlock;
  if (pVVar8->nextSibling != (VmBlock *)0x0) {
    __assert_fail("!block->nextSibling",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                  ,0x1a4d,"void RunFunctionInlining(ExpressionContext &, VmModule *, VmValue *)");
  }
  local_148.data = local_148.storage;
  local_148.allocator = (Allocator *)0x0;
  local_148._0_8_ = (VariableData *)0x10;
  NULLC::fillMemory(local_148.data,0,0x100);
  iVar19 = (int)in_stack_fffffffffffffd28;
  uVar18 = (uint)in_R9;
  local_2b0 = pVVar8->firstInstruction;
  instruction = pVVar22;
  if (local_2b0 != (VmInstruction *)0x0) {
    pVVar20 = local_2a8;
    do {
      if (local_2b0->cmd == VM_INST_RETURN) {
        if (local_2a0 != (VmConstant *)0x0) {
          if ((local_2b0->arguments).count == 0) goto LAB_001a28b2;
          in_R9 = (VmConstant *)
                  RemapInstructionArgument
                            (ctx,module,*(local_2b0->arguments).data,&local_260,&local_148);
          in_stack_fffffffffffffd28 = 0;
          anon_unknown.dwarf_107107::CreateStore
                    (ctx,module,(pVVar22->super_VmValue).source,pVVar20->function->type->returnType,
                     &local_2a0->super_VmValue,(VmValue *)in_R9,0);
        }
      }
      else {
        in_stack_fffffffffffffd28 = 0;
        in_R9 = (VmConstant *)0x0;
        type.structType._0_4_ = local_2b0->cmd;
        type._0_8_ = (local_2b0->super_VmValue).type.structType;
        type.structType._4_4_ = 0;
        local_280 = anon_unknown.dwarf_107107::CreateInstruction
                              ((anon_unknown_dwarf_107107 *)module,
                               (VmModule *)(pVVar22->super_VmValue).source,
                               *(SynBase **)&(local_2b0->super_VmValue).type,type,VM_INST_LOAD_BYTE,
                               (VmValue *)0x0,(VmValue *)0x0,(VmValue *)0x0,(VmValue *)0x0,
                               &instruction->super_VmValue);
        SmallDenseMap<VmInstruction_*,_VmInstruction_*,_VmInstructionHasher,_16U>::insert
                  (&local_148,&local_2b0,&local_280);
        pVVar20 = local_2a8;
        if ((local_2b0->arguments).count != 0) {
          uVar16 = 0;
          do {
            pVVar13 = RemapInstructionArgument
                                (ctx,module,(local_2b0->arguments).data[uVar16],&local_260,
                                 &local_148);
            VmInstruction::AddArgument(local_280,pVVar13);
            uVar16 = uVar16 + 1;
            pVVar20 = local_2a8;
          } while (uVar16 < (local_2b0->arguments).count);
        }
      }
      iVar19 = (int)in_stack_fffffffffffffd28;
      uVar18 = (uint)in_R9;
      local_2b0 = local_2b0->nextSibling;
    } while (local_2b0 != (VmInstruction *)0x0);
  }
  if (local_270->container == (VariableData *)0x0) {
    if (local_2a0 != (VmConstant *)0x0) {
      pVVar13 = anon_unknown.dwarf_107107::CreateLoad
                          (ctx,module,(instruction->super_VmValue).source,local_288,
                           &local_2a0->super_VmValue,uVar18);
      anon_unknown.dwarf_107107::ReplaceValueUsersWith
                (module,&instruction->super_VmValue,pVVar13,(uint *)0x0);
      VmBlock::RemoveInstruction(instruction->parent,instruction);
      goto LAB_001a2852;
    }
  }
  else {
    pSVar6 = (pVVar22->super_VmValue).source;
    pVVar12 = CloneRemappedPointer(ctx,local_270);
    anon_unknown.dwarf_107107::CreateMemCopy
              (module,pSVar6,&pVVar12->super_VmValue,0,&local_2a0->super_VmValue,
               (uint)local_288->size,iVar19);
  }
  VmBlock::RemoveInstruction(instruction->parent,instruction);
LAB_001a2852:
  module->functionInlines = module->functionInlines + 1;
  module->currentBlock->insertPoint = module->currentBlock->lastInstruction;
  SmallDenseMap<VmInstruction_*,_VmInstruction_*,_VmInstructionHasher,_16U>::~SmallDenseMap
            (&local_148);
  SmallDenseMap<VariableData_*,_VmConstant_*,_VariableDataHasher,_16U>::~SmallDenseMap(&local_260);
  return;
}

Assistant:

VmValue* CreateOr(VmModule *module, SynBase *source, VmValue *lhs, VmValue *rhs)
	{
		assert(lhs->type == VmType::Int || lhs->type == VmType::Long);
		assert(lhs->type == rhs->type);

		return CreateInstruction(module, source, lhs->type, VM_INST_BIT_OR, lhs, rhs);
	}